

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O3

ON_SHA1_Hash * __thiscall
ON_Annotation::Internal_GetBBox_InputHash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_Annotation *this,ON_Viewport *vp,
          ON_DimStyle *dimstyle,double dimscale,ON_2dPoint *text_point,uint point_count,
          ON_2dPoint *points)

{
  double x;
  bool bVar1;
  ON_SHA1_Hash *sub_hash;
  ON_SHA1 sha1;
  ON_BoundingBox textbbox;
  ON_SHA1 local_e8;
  ON_BoundingBox local_60;
  
  local_e8.m_state[2] = 0;
  local_e8.m_state[3] = 0;
  local_e8.m_state[4] = 0;
  local_e8.m_bit_count[0] = 0;
  local_e8.m_bit_count[1] = 0;
  local_e8.m_state[0] = 0;
  local_e8.m_state[1] = 0;
  local_e8.m_buffer[0x30] = '\0';
  local_e8.m_buffer[0x31] = '\0';
  local_e8.m_buffer[0x32] = '\0';
  local_e8.m_buffer[0x33] = '\0';
  local_e8.m_buffer[0x34] = '\0';
  local_e8.m_buffer[0x35] = '\0';
  local_e8.m_buffer[0x36] = '\0';
  local_e8.m_buffer[0x37] = '\0';
  local_e8.m_buffer[0x38] = '\0';
  local_e8.m_buffer[0x39] = '\0';
  local_e8.m_buffer[0x3a] = '\0';
  local_e8.m_buffer[0x3b] = '\0';
  local_e8.m_buffer[0x3c] = '\0';
  local_e8.m_buffer[0x3d] = '\0';
  local_e8.m_buffer[0x3e] = '\0';
  local_e8.m_buffer[0x3f] = '\0';
  local_e8.m_buffer[0x20] = '\0';
  local_e8.m_buffer[0x21] = '\0';
  local_e8.m_buffer[0x22] = '\0';
  local_e8.m_buffer[0x23] = '\0';
  local_e8.m_buffer[0x24] = '\0';
  local_e8.m_buffer[0x25] = '\0';
  local_e8.m_buffer[0x26] = '\0';
  local_e8.m_buffer[0x27] = '\0';
  local_e8.m_buffer[0x28] = '\0';
  local_e8.m_buffer[0x29] = '\0';
  local_e8.m_buffer[0x2a] = '\0';
  local_e8.m_buffer[0x2b] = '\0';
  local_e8.m_buffer[0x2c] = '\0';
  local_e8.m_buffer[0x2d] = '\0';
  local_e8.m_buffer[0x2e] = '\0';
  local_e8.m_buffer[0x2f] = '\0';
  local_e8.m_buffer[0x10] = '\0';
  local_e8.m_buffer[0x11] = '\0';
  local_e8.m_buffer[0x12] = '\0';
  local_e8.m_buffer[0x13] = '\0';
  local_e8.m_buffer[0x14] = '\0';
  local_e8.m_buffer[0x15] = '\0';
  local_e8.m_buffer[0x16] = '\0';
  local_e8.m_buffer[0x17] = '\0';
  local_e8.m_buffer[0x18] = '\0';
  local_e8.m_buffer[0x19] = '\0';
  local_e8.m_buffer[0x1a] = '\0';
  local_e8.m_buffer[0x1b] = '\0';
  local_e8.m_buffer[0x1c] = '\0';
  local_e8.m_buffer[0x1d] = '\0';
  local_e8.m_buffer[0x1e] = '\0';
  local_e8.m_buffer[0x1f] = '\0';
  local_e8.m_buffer[0] = '\0';
  local_e8.m_buffer[1] = '\0';
  local_e8.m_buffer[2] = '\0';
  local_e8.m_buffer[3] = '\0';
  local_e8.m_buffer[4] = '\0';
  local_e8.m_buffer[5] = '\0';
  local_e8.m_buffer[6] = '\0';
  local_e8.m_buffer[7] = '\0';
  local_e8.m_buffer[8] = '\0';
  local_e8.m_buffer[9] = '\0';
  local_e8.m_buffer[10] = '\0';
  local_e8.m_buffer[0xb] = '\0';
  local_e8.m_buffer[0xc] = '\0';
  local_e8.m_buffer[0xd] = '\0';
  local_e8.m_buffer[0xe] = '\0';
  local_e8.m_buffer[0xf] = '\0';
  local_e8.m_byte_count = 0;
  local_e8.m_status_bits = 0;
  local_e8.m_reserved = 0;
  ON_SHA1_Hash::ON_SHA1_Hash(&local_e8.m_sha1_hash);
  if (vp != (ON_Viewport *)0x0) {
    ON_Viewport::ViewProjectionContentHash((ON_SHA1_Hash *)&local_60,vp);
    ON_SHA1::AccumulateSubHash(&local_e8,(ON_SHA1_Hash *)&local_60);
  }
  if (dimstyle != (ON_DimStyle *)0x0) {
    sub_hash = ON_DimStyle::ContentHash(dimstyle);
    ON_SHA1::AccumulateSubHash(&local_e8,sub_hash);
  }
  ON_SHA1::AccumulateDouble(&local_e8,dimscale);
  ON_SHA1::Accumulate3dVector(&local_e8,&(this->m_plane).xaxis);
  ON_SHA1::Accumulate3dVector(&local_e8,&(this->m_plane).yaxis);
  ON_SHA1::Accumulate3dVector(&local_e8,&(this->m_plane).zaxis);
  ON_SHA1::AccumulateDoubleArray(&local_e8,4,&(this->m_plane).plane_equation.x);
  if (this->m_text != (ON_TextContent *)0x0) {
    ON_Geometry::BoundingBox(&local_60,&this->m_text->super_ON_Geometry);
    ON_SHA1::AccumulateBoundingBox(&local_e8,&local_60);
    bVar1 = ON_BoundingBox::IsNotEmpty(&local_60);
    if (bVar1) {
      bVar1 = DimstyleHasMask(dimstyle);
      if (bVar1) {
        x = ON_DimStyle::MaskBorder(dimstyle);
        ON_SHA1::AccumulateDouble(&local_e8,x);
      }
    }
  }
  ON_SHA1::Accumulate2dPoint(&local_e8,text_point);
  ON_SHA1::AccumulateUnsigned32(&local_e8,point_count);
  if (points != (ON_2dPoint *)0x0 && point_count != 0) {
    ON_SHA1::AccumulateDoubleArray(&local_e8,(ulong)(point_count * 2),&points->x);
  }
  ON_SHA1::Hash(__return_storage_ptr__,&local_e8);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_Annotation::Internal_GetBBox_InputHash(
  const ON_Viewport* vp,
  const ON_DimStyle* dimstyle,
  double dimscale,
  const ON_2dPoint& text_point,
  unsigned int point_count,
  const ON_2dPoint* points
) const
{
  ON_SHA1 sha1;
  if (nullptr != vp)
    sha1.AccumulateSubHash(vp->ViewProjectionContentHash());
  if ( nullptr != dimstyle )
    sha1.AccumulateSubHash(dimstyle->ContentHash());
  sha1.AccumulateDouble(dimscale);
  
  sha1.Accumulate3dVector(m_plane.xaxis);
  sha1.Accumulate3dVector(m_plane.yaxis);
  sha1.Accumulate3dVector(m_plane.zaxis);
  sha1.AccumulateDoubleArray(4,&m_plane.plane_equation.x);

  if (nullptr != m_text)
  {
    // This return ON_TextContent.m_mbox
    // which is a cached value
    const ON_BoundingBox textbbox = m_text->BoundingBox();
    sha1.AccumulateBoundingBox(textbbox);
    if (textbbox.IsNotEmpty() && DimstyleHasMask(dimstyle))
    {
      sha1.AccumulateDouble(dimstyle->MaskBorder());
    }
  }

  sha1.Accumulate2dPoint(text_point);
  sha1.AccumulateUnsigned32(point_count);
  if (point_count > 0 && nullptr != points)
    sha1.AccumulateDoubleArray(2 * point_count, &points[0].x);

  return sha1.Hash();
}